

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getCostsTimeRanges(OptimalControlProblem *this)

{
  undefined8 *puVar1;
  OptimalControlProblemPimpl *pOVar2;
  size_type __new_size;
  pointer pTVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_header *p_Var6;
  long lVar7;
  
  pOVar2 = this->m_pimpl;
  __new_size = (pOVar2->costs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (((long)(pOVar2->costTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pOVar2->costTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size != 0
     ) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pOVar2->costTimeRanges,__new_size);
  }
  p_Var5 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    lVar7 = 0;
    do {
      pTVar3 = (this->m_pimpl->costTimeRanges).
               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pTVar3->m_anyTime)[lVar7] = SUB41(p_Var5[9]._M_color,0);
      p_Var4 = p_Var5[8]._M_right;
      puVar1 = (undefined8 *)((long)&pTVar3->m_initTime + lVar7);
      *puVar1 = p_Var5[8]._M_left;
      puVar1[1] = p_Var4;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      lVar7 = lVar7 + 0x18;
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  return &this->m_pimpl->costTimeRanges;
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getCostsTimeRanges() const
        {
            if (m_pimpl->costTimeRanges.size() != m_pimpl->costs.size()) {
                m_pimpl->costTimeRanges.resize(m_pimpl->costs.size());
            }

            size_t i = 0;
            for (auto& c : m_pimpl->costs){
                m_pimpl->costTimeRanges[i] = c.second.timeRange;
                ++i;
            }
            return m_pimpl->costTimeRanges;
        }